

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.hpp
# Opt level: O3

PhysicalExpressionScan * __thiscall
duckdb::PhysicalOperator::Cast<duckdb::PhysicalExpressionScan>(PhysicalOperator *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == EXPRESSION_SCAN) {
    return (PhysicalExpressionScan *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Failed to cast physical operator to type - physical operator type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != PhysicalOperatorType::INVALID && type != TARGET::TYPE) {
			throw InternalException("Failed to cast physical operator to type - physical operator type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}